

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase693::run(TestCase693 *this)

{
  byte *pbVar1;
  char *pcVar2;
  size_t sVar3;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params_00;
  Reader value;
  String local_1b8;
  char *local_1a0;
  Builder root;
  DebugComparison<const_char_(&)[33],_kj::String> _kjCondition;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> l;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&l,&builder.super_MessageBuilder);
  _kjCondition.right.content.size_ = (size_t)l.builder.ptr;
  _kjCondition.left = (char (*) [33])l.builder.segment;
  _kjCondition.right.content.ptr = (char *)l.builder.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x20000);
  _kjCondition.left = (char (*) [33])root._builder.segment;
  _kjCondition.right.content.ptr = (char *)root._builder.capTable;
  _kjCondition.right.content.size_ = (size_t)root._builder.pointers;
  value.super_StringPtr.content.size_ = 5;
  value.super_StringPtr.content.ptr = "abcd";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition,value);
  _kjCondition.right.content.size_ = (size_t)(root._builder.pointers + 1);
  _kjCondition.left = (char (*) [33])root._builder.segment;
  _kjCondition.right.content.ptr = (char *)root._builder.capTable;
  PointerBuilder::initList(&l.builder,(PointerBuilder *)&_kjCondition,FOUR_BYTES,2);
  l.builder.ptr[0] = '{';
  l.builder.ptr[1] = '\0';
  l.builder.ptr[2] = '\0';
  l.builder.ptr[3] = '\0';
  pbVar1 = l.builder.ptr + (l.builder.step >> 3);
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  local_1a0 = "(foo = \"abcd\", bar = [123, 456])";
  kj::
  str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
            (&local_1b8,(kj *)&root,params);
  kj::_::DebugExpression<char_const(&)[33]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[33]> *)&local_1a0,&local_1b8);
  sVar3 = local_1b8.content.size_;
  pcVar2 = local_1b8.content.ptr;
  params_00 = extraout_RDX;
  if (local_1b8.content.ptr != (char *)0x0) {
    local_1b8.content.ptr = (char *)0x0;
    local_1b8.content.size_ = 0;
    (**(local_1b8.content.disposer)->_vptr_ArrayDisposer)
              (local_1b8.content.disposer,pcVar2,1,sVar3,sVar3,0);
    params_00 = extraout_RDX_00;
  }
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::
    str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
              (&local_1b8,(kj *)&root,params_00);
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[33],kj::String>&,char_const(&)[33],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x2bd,ERROR,
               "\"failed: expected \" \"(\\\"(foo = \\\\\\\"abcd\\\\\\\", bar = [123, 456])\\\") == (kj::str(root))\", _kjCondition, \"(foo = \\\"abcd\\\", bar = [123, 456])\", kj::str(root)"
               ,(char (*) [75])
                "failed: expected (\"(foo = \\\"abcd\\\", bar = [123, 456])\") == (kj::str(root))",
               &_kjCondition,(char (*) [33])"(foo = \"abcd\", bar = [123, 456])",&local_1b8);
    sVar3 = local_1b8.content.size_;
    pcVar2 = local_1b8.content.ptr;
    if (local_1b8.content.ptr != (char *)0x0) {
      local_1b8.content.ptr = (char *)0x0;
      local_1b8.content.size_ = 0;
      (**(local_1b8.content.disposer)->_vptr_ArrayDisposer)
                (local_1b8.content.disposer,pcVar2,1,sVar3,sVar3,0);
    }
  }
  sVar3 = _kjCondition.right.content.size_;
  pcVar2 = _kjCondition.right.content.ptr;
  if (_kjCondition.right.content.ptr != (char *)0x0) {
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    (**(_kjCondition.right.content.disposer)->_vptr_ArrayDisposer)
              (_kjCondition.right.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, Generics) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGenerics<Text, List<uint32_t>>::Inner>();
  root.setFoo("abcd");
  auto l = root.initBar(2);
  l.set(0, 123);
  l.set(1, 456);

  EXPECT_EQ("(foo = \"abcd\", bar = [123, 456])", kj::str(root));
}